

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  SPIRVariable *pSVar1;
  SPIREntryPoint *pSVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  CompilerError *this_00;
  bool bVar4;
  allocator local_39;
  string local_38;
  
  pSVar1 = get<spirv_cross::SPIRVariable>(this,id);
  if ((pSVar1->storage < StorageClassWorkgroup) && (pSVar1->storage != StorageClassUniform)) {
    bVar4 = true;
    if (1 < (this->ir).entry_points._M_h._M_element_count) {
      pSVar2 = get_entry_point(this);
      pTVar3 = (pSVar2->interface_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      local_38._M_dataplus._M_p._0_4_ = id;
      pTVar3 = ::std::
               __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>const*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                         (pTVar3,pTVar3 + (pSVar2->interface_variables).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                          .buffer_size);
      bVar4 = pTVar3 != (pSVar2->interface_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr +
                        (pSVar2->interface_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    }
    return bVar4;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Only Input, Output variables and Uniform constants are part of a shader linking interface."
             ,&local_39);
  CompilerError::CompilerError(this_00,&local_38);
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);
	if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
	    var.storage != StorageClassUniformConstant)
		SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

	// This is to avoid potential problems with very old glslang versions which did
	// not emit input/output interfaces properly.
	// We can assume they only had a single entry point, and single entry point
	// shaders could easily be assumed to use every interface variable anyways.
	if (ir.entry_points.size() <= 1)
		return true;

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}